

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O1

string * __thiscall
google::protobuf::compiler::php::GeneratedMessageFileName_abi_cxx11_
          (string *__return_storage_ptr__,php *this,Descriptor *message,bool is_descriptor)

{
  ulong uVar1;
  string result;
  string local_38;
  
  FullClassName<google::protobuf::Descriptor>(&local_38,(Descriptor *)this,SUB81(message,0));
  if (local_38._M_string_length != 0) {
    uVar1 = 0;
    do {
      if (local_38._M_dataplus._M_p[uVar1] == '\\') {
        local_38._M_dataplus._M_p[uVar1] = '/';
      }
      uVar1 = uVar1 + 1;
    } while (uVar1 < local_38._M_string_length);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,local_38._M_dataplus._M_p,
             local_38._M_dataplus._M_p + local_38._M_string_length);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GeneratedMessageFileName(const Descriptor* message,
                                     bool is_descriptor) {
  std::string result = FullClassName(message, is_descriptor);
  for (int i = 0; i < result.size(); i++) {
    if (result[i] == '\\') {
      result[i] = '/';
    }
  }
  return result + ".php";
}